

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTools.h
# Opt level: O3

bool containsLinkedToken(vector<LinkedToken,_std::allocator<LinkedToken>_> *linkedTokens,
                        LinkedToken *linkedTokenToFind)

{
  IResultCapture *pIVar1;
  long *plVar2;
  __normal_iterator<const_LinkedToken_*,_std::vector<LinkedToken,_std::allocator<LinkedToken>_>_>
  _Var3;
  long *plVar4;
  pointer pLVar5;
  pointer this;
  MessageBuilder local_100;
  StringRef local_a0;
  SourceLineInfo local_90;
  vector<LinkedToken,_std::allocator<LinkedToken>_> *local_80;
  LinkedToken *local_78;
  string local_70;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  pIVar1 = Catch::getResultCapture();
  local_a0.m_start = "UNSCOPED_INFO";
  local_a0.m_size = 0xd;
  local_90.file =
       "/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/test/TestTools.h";
  local_90.line = 0x3a;
  Catch::MessageBuilder::MessageBuilder(&local_100,&local_a0,&local_90,Info);
  LinkedToken::toLink_abi_cxx11_(&local_70,linkedTokenToFind);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x1ebe85);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_40 = *plVar4;
    lStack_38 = plVar2[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar4;
    local_50 = (long *)*plVar2;
  }
  local_48 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__ostream_insert<char,std::char_traits<char>>
            (local_100.super_MessageStream.m_stream.m_oss,(char *)local_50,local_48);
  (*pIVar1->_vptr_IResultCapture[8])(pIVar1,&local_100);
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_info.message._M_dataplus._M_p != &local_100.m_info.message.field_2) {
    operator_delete(local_100.m_info.message._M_dataplus._M_p,
                    local_100.m_info.message.field_2._M_allocated_capacity + 1);
  }
  Catch::ReusableStringStream::~ReusableStringStream((ReusableStringStream *)&local_100);
  this = (linkedTokens->super__Vector_base<LinkedToken,_std::allocator<LinkedToken>_>)._M_impl.
         super__Vector_impl_data._M_start;
  pLVar5 = (linkedTokens->super__Vector_base<LinkedToken,_std::allocator<LinkedToken>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (this != pLVar5) {
    local_80 = linkedTokens;
    local_78 = linkedTokenToFind;
    do {
      pIVar1 = Catch::getResultCapture();
      local_a0.m_start = "UNSCOPED_INFO";
      local_a0.m_size = 0xd;
      local_90.file =
           "/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/test/TestTools.h"
      ;
      local_90.line = 0x3c;
      Catch::MessageBuilder::MessageBuilder(&local_100,&local_a0,&local_90,Info);
      LinkedToken::toLink_abi_cxx11_(&local_70,this);
      plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x1ebe8e);
      local_50 = &local_40;
      plVar4 = plVar2 + 2;
      if ((long *)*plVar2 == plVar4) {
        local_40 = *plVar4;
        lStack_38 = plVar2[3];
      }
      else {
        local_40 = *plVar4;
        local_50 = (long *)*plVar2;
      }
      local_48 = plVar2[1];
      *plVar2 = (long)plVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__ostream_insert<char,std::char_traits<char>>
                (local_100.super_MessageStream.m_stream.m_oss,(char *)local_50,local_48);
      (*pIVar1->_vptr_IResultCapture[8])(pIVar1,&local_100);
      if (local_50 != &local_40) {
        operator_delete(local_50,local_40 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100.m_info.message._M_dataplus._M_p != &local_100.m_info.message.field_2) {
        operator_delete(local_100.m_info.message._M_dataplus._M_p,
                        local_100.m_info.message.field_2._M_allocated_capacity + 1);
      }
      Catch::ReusableStringStream::~ReusableStringStream((ReusableStringStream *)&local_100);
      this = this + 1;
    } while (this != pLVar5);
    this = (local_80->super__Vector_base<LinkedToken,_std::allocator<LinkedToken>_>)._M_impl.
           super__Vector_impl_data._M_start;
    pLVar5 = (local_80->super__Vector_base<LinkedToken,_std::allocator<LinkedToken>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    linkedTokenToFind = local_78;
    linkedTokens = local_80;
  }
  _Var3 = std::
          __find_if<__gnu_cxx::__normal_iterator<LinkedToken_const*,std::vector<LinkedToken,std::allocator<LinkedToken>>>,__gnu_cxx::__ops::_Iter_pred<containsLinkedToken(std::vector<LinkedToken,std::allocator<LinkedToken>>const&,LinkedToken_const&)::_lambda(LinkedToken_const&)_1_>>
                    (this,pLVar5,linkedTokenToFind);
  return _Var3._M_current !=
         (linkedTokens->super__Vector_base<LinkedToken,_std::allocator<LinkedToken>_>)._M_impl.
         super__Vector_impl_data._M_finish;
}

Assistant:

inline bool containsLinkedToken(const std::vector<LinkedToken>& linkedTokens, const LinkedToken& linkedTokenToFind) {
    UNSCOPED_INFO("ToFind: " + linkedTokenToFind.toLink());
    for (const LinkedToken& lt : linkedTokens) {
        UNSCOPED_INFO("In list: " + lt.toLink());
    }

    return std::find_if(linkedTokens.begin(), linkedTokens.end(), [&](const LinkedToken& t) {
        return (t.token.content == linkedTokenToFind.token.content) and (t.token.type == linkedTokenToFind.token.type) and (t.link == linkedTokenToFind.link);
    }) != linkedTokens.end();
}